

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O2

void resizeLatLong(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,
                  float filterRadius,int numSamples)

{
  int iVar1;
  int iVar2;
  Array2D<Imf_3_2::Rgba> *pAVar3;
  Rgba RVar4;
  long lVar5;
  int x;
  long lVar6;
  long lVar7;
  long lVar8;
  V3f dir;
  V3f local_50;
  V3f local_40;
  
  lVar7 = (long)(image2DataWindow->max).x - (long)(image2DataWindow->min).x;
  iVar1 = (image2DataWindow->max).y;
  iVar2 = (image2DataWindow->min).y;
  lVar8 = 0;
  EnvmapImage::resize(image2,ENVMAP_LATLONG,image2DataWindow);
  EnvmapImage::clear(image2);
  pAVar3 = EnvmapImage::pixels(image2);
  for (lVar5 = 0; lVar5 <= (long)iVar1 - (long)iVar2; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
      Imf_3_2::LatLongMap::direction((Box *)&local_40,(Vec2 *)image2DataWindow);
      local_50.x = local_40.x;
      local_50.y = local_40.y;
      local_50.z = local_40.z;
      RVar4 = EnvmapImage::filteredLookup
                        (image1,&local_50,(filterRadius * 3.1415927) / (float)((int)lVar7 + 1),
                         numSamples);
      *(Rgba *)((long)&pAVar3->_data[lVar6].r._h + pAVar3->_sizeY * lVar8) = RVar4;
    }
    lVar8 = lVar8 + 8;
  }
  return;
}

Assistant:

void
resizeLatLong (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    int   w      = image2DataWindow.max.x - image2DataWindow.min.x + 1;
    int   h      = image2DataWindow.max.y - image2DataWindow.min.y + 1;
    float radius = 0.5f * 2 * M_PI * filterRadius / w;

    image2.resize (ENVMAP_LATLONG, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            V3f dir      = LatLongMap::direction (image2DataWindow, V2f (x, y));
            pixels[y][x] = image1.filteredLookup (dir, radius, numSamples);
        }
    }
}